

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O1

pair<long,_long> pstore::utf::slice(czstring str,ptrdiff_t start,ptrdiff_t end)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  pair<long,_long> pVar7;
  pair<long,_long> pVar8;
  size_t start_count;
  undefined8 local_38;
  
  if (str != (czstring)0x0) {
    sVar1 = strlen(str);
    pcVar6 = str + sVar1;
    if (start < 1) {
      start = 0;
    }
    local_38 = 0;
    pcVar2 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<char_const*>(char_const*,char_const*,unsigned_long)::_lambda(char)_1_>>
                       (str,pcVar6,&local_38,start);
    if (end < 1) {
      end = 0;
    }
    local_38 = 0;
    pcVar3 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<char_const*>(char_const*,char_const*,unsigned_long)::_lambda(char)_1_>>
                       (str,pcVar6,&local_38,end);
    lVar4 = (long)pcVar2 - (long)str;
    if (pcVar2 == pcVar6) {
      lVar4 = -1;
    }
    lVar5 = (long)pcVar3 - (long)str;
    if (pcVar3 == pcVar6) {
      lVar5 = -1;
    }
    pVar7.second = lVar5;
    pVar7.first = lVar4;
    return pVar7;
  }
  pVar8.second = -1;
  pVar8.first = -1;
  return pVar8;
}

Assistant:

auto slice (gsl::czstring const str, std::ptrdiff_t const start, std::ptrdiff_t const end)
            -> std::pair<std::ptrdiff_t, std::ptrdiff_t> {

            if (str == nullptr) {
                return std::make_pair (-1, -1);
            }

            auto const * const first = str;
            auto const * const last = str + strlen (str);
            gsl::czstring p1 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, start)));
            gsl::czstring p2 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, end)));
            return std::make_pair ((p1 != last) ? p1 - str : -1, (p2 != last) ? p2 - str : -1);
        }